

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O1

void assert_correct_relation_between_relops<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>
               (markable<mark_TOD_cmp,_ak_toolkit::markable_ns::order_by_representation> *a,
               markable<mark_TOD_cmp,_ak_toolkit::markable_ns::order_by_representation> *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
  bVar2 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(b,a);
  if (bVar1 != bVar2) {
    __assert_fail("(a == b) == (b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fa,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
  bVar2 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(b,a);
  if (bVar1 != bVar2) {
    __assert_fail("(a != b) == (b != a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fb,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
  bVar2 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
  if (bVar1 != bVar2) {
    __assert_fail("(a != b) == !(a == b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fc,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(b,a);
  bVar2 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(b,a);
  if (bVar1 != bVar2) {
    __assert_fail("(b != a) == !(b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fd,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
          markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
          order_by_representation>(a,b);
  bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
          markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
          order_by_representation>(a,b);
  if (bVar1 != bVar2) {
    __assert_fail("(a < b) == (b > a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1ff,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
          markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
          order_by_representation>(a,b);
  bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
          markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
          order_by_representation>(a,b);
  if (bVar1 != bVar2) {
    __assert_fail("(a < b) == !(a >= b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x200,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
          markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
          order_by_representation>(a,b);
  bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
          markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
          order_by_representation>(a,b);
  if (bVar1 != bVar2) {
    __assert_fail("(a < b) == !(b <= a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x201,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::order_by_representation::
          equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
  bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
          markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
          order_by_representation>(a,b);
  bVar3 = false;
  if (!bVar2) {
    bVar3 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
            markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
            order_by_representation>(b,a);
    bVar3 = !bVar3;
  }
  if (bVar3 == bVar1) {
    bVar1 = ak_toolkit::markable_ns::order_by_representation::
            equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
    bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
            markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
            order_by_representation>(a,b);
    bVar3 = false;
    if (!bVar2) {
      bVar3 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
              markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
              order_by_representation>(b,a);
      bVar3 = !bVar3;
    }
    if (bVar3 != bVar1) {
      __assert_fail("(a == b) == (!(a < b) && !(a > b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x204,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                   );
    }
    bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
            markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
            order_by_representation>(b,a);
    bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
            markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
            order_by_representation>(a,b);
    bVar3 = true;
    if (!bVar2) {
      bVar3 = ak_toolkit::markable_ns::order_by_representation::
              equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
    }
    if (bVar3 == !bVar1) {
      bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
              markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
              order_by_representation>(a,b);
      bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit::
              markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
              order_by_representation>(b,a);
      bVar3 = false;
      if (!bVar2) {
        bVar3 = ak_toolkit::markable_ns::order_by_representation::
                equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
        bVar3 = !bVar3;
      }
      if (bVar3 == bVar1) {
        bVar1 = ak_toolkit::markable_ns::order_by_representation::
                equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
        bVar2 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit
                ::markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
                order_by_representation>(b,a);
        if (bVar1 == bVar2) {
          bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit
                  ::markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns
                  ::order_by_representation>(a,b);
          if (!bVar1) {
            __assert_fail("(a != b) == (a > b) || (b > a)",
                          "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                          ,0x207,
                          "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                         );
          }
        }
        bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit
                ::markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
                order_by_representation>(a,b);
        if (bVar1) {
          bVar1 = ak_toolkit::markable_ns::order_by_representation::
                  equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
          if (bVar1) {
            __assert_fail("a != b",
                          "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                          ,0x209,
                          "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                         );
          }
        }
        bVar1 = ((({parm#1}.representation_value)())<(({parm#2}.representation_value)()))ak_toolkit
                ::markable_ns::order_by_representation::less<mark_TOD_cmp,ak_toolkit::markable_ns::
                order_by_representation>(b,a);
        if (bVar1) {
          bVar1 = ak_toolkit::markable_ns::order_by_representation::
                  equal<mark_TOD_cmp,ak_toolkit::markable_ns::order_by_representation>(a,b);
          if (bVar1) {
            __assert_fail("a != b",
                          "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                          ,0x20a,
                          "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                         );
          }
        }
        return;
      }
      __assert_fail("(a < b) == (!(a > b) && !(a == b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x206,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                   );
    }
    __assert_fail("(a <= b) == ((a < b) || (a == b))",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x205,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
                 );
  }
  __assert_fail("(a == b) == (a >= b && a <= b)",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x203,
                "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_TOD_cmp, OP = ak_toolkit::markable_ns::order_by_representation]"
               );
}

Assistant:

void assert_correct_relation_between_relops
  (markable<MP, OP> const& a, markable<MP, OP> const& b)
{
  assert( (a == b) ==  (b == a) );
  assert( (a != b) ==  (b != a) );
  assert( (a != b) == !(a == b) );
  assert( (b != a) == !(b == a) );

  assert( (a < b) == (b > a) );
  assert( (a < b) == !(a >= b) );
  assert( (a < b) == !(b <= a) );

  assert( (a == b) == (a >= b && a <= b) );
  assert( (a == b) == (!(a < b) && !(a > b)) );
  assert( (a <= b) == ((a < b) || (a == b)) );
  assert( (a < b) == (!(a > b) && !(a == b)) );
  assert( (a != b) == (a > b) || (b > a) );

  if (a < b) assert(a != b);
  if (a > b) assert(a != b);
}